

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes SzArEx_Extract(CSzArEx *p,ILookInStream *inStream,UInt32 fileIndex,UInt32 *blockIndex,
                   Byte **tempBuf,size_t *outBufferSize,size_t *offset,size_t *outSizeProcessed,
                   ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  uint folderIndex;
  UInt64 *pUVar1;
  UInt64 UVar2;
  bool bVar3;
  int iVar4;
  UInt32 UVar5;
  Byte *pBVar6;
  size_t sVar7;
  ulong uVar8;
  
  folderIndex = p->FileToFolder[fileIndex];
  uVar8 = (ulong)folderIndex;
  iVar4 = 0;
  *offset = 0;
  *outSizeProcessed = 0;
  if (uVar8 == 0xffffffff) {
    (*allocMain->Free)(allocMain,*tempBuf);
    *blockIndex = 0xffffffff;
    *tempBuf = (Byte *)0x0;
    *outBufferSize = 0;
  }
  else {
    pBVar6 = *tempBuf;
    if ((pBVar6 == (Byte *)0x0) || (iVar4 = 0, *blockIndex != folderIndex)) {
      sVar7 = (p->db).CoderUnpackSizes
              [(uint)(p->db).FoToMainUnpackSizeIndex[uVar8] + (p->db).FoToCoderUnpackSizes[uVar8]];
      *blockIndex = folderIndex;
      (*allocMain->Free)(allocMain,pBVar6);
      *tempBuf = (Byte *)0x0;
      *outBufferSize = sVar7;
      if (sVar7 == 0) {
        iVar4 = 0;
        bVar3 = true;
      }
      else {
        pBVar6 = (Byte *)(*allocMain->Alloc)(allocMain,sVar7);
        *tempBuf = pBVar6;
        bVar3 = pBVar6 != (Byte *)0x0;
        iVar4 = (uint)(pBVar6 == (Byte *)0x0) * 2;
      }
      if (bVar3) {
        iVar4 = SzAr_DecodeFolder(&p->db,folderIndex,inStream,p->dataPos,*tempBuf,sVar7,allocTemp);
      }
    }
    if (iVar4 == 0) {
      pUVar1 = p->UnpackPositions;
      UVar2 = pUVar1[fileIndex];
      *offset = UVar2 - pUVar1[p->FolderToFile[uVar8]];
      sVar7 = pUVar1[fileIndex + 1] - UVar2;
      *outSizeProcessed = sVar7;
      iVar4 = 0xb;
      if (*offset + sVar7 <= *outBufferSize) {
        pBVar6 = (p->CRCs).Defs;
        iVar4 = 0;
        if ((pBVar6 != (Byte *)0x0) &&
           ((char)(pBVar6[fileIndex >> 3] << ((byte)fileIndex & 7)) < '\0')) {
          UVar5 = CrcCalc(*tempBuf + *offset,sVar7);
          iVar4 = (uint)(UVar5 != (p->CRCs).Vals[fileIndex]) * 3;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

SRes SzArEx_Extract(
    const CSzArEx *p,
    ILookInStream *inStream,
    UInt32 fileIndex,
    UInt32 *blockIndex,
    Byte **tempBuf,
    size_t *outBufferSize,
    size_t *offset,
    size_t *outSizeProcessed,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp)
{
  UInt32 folderIndex = p->FileToFolder[fileIndex];
  SRes res = SZ_OK;
  
  *offset = 0;
  *outSizeProcessed = 0;
  
  if (folderIndex == (UInt32)-1)
  {
    IAlloc_Free(allocMain, *tempBuf);
    *blockIndex = folderIndex;
    *tempBuf = NULL;
    *outBufferSize = 0;
    return SZ_OK;
  }

  if (*tempBuf == NULL || *blockIndex != folderIndex)
  {
    UInt64 unpackSizeSpec = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
    /*
    UInt64 unpackSizeSpec =
        p->UnpackPositions[p->FolderToFile[folderIndex + 1]] -
        p->UnpackPositions[p->FolderToFile[folderIndex]];
    */
    size_t unpackSize = (size_t)unpackSizeSpec;

    if (unpackSize != unpackSizeSpec)
      return SZ_ERROR_MEM;
    *blockIndex = folderIndex;
    IAlloc_Free(allocMain, *tempBuf);
    *tempBuf = NULL;
    
    if (res == SZ_OK)
    {
      *outBufferSize = unpackSize;
      if (unpackSize != 0)
      {
        *tempBuf = (Byte *)IAlloc_Alloc(allocMain, unpackSize);
        if (*tempBuf == NULL)
          res = SZ_ERROR_MEM;
      }
  
      if (res == SZ_OK)
      {
        res = SzAr_DecodeFolder(&p->db, folderIndex,
            inStream, p->dataPos, *tempBuf, unpackSize, allocTemp);
      }
    }
  }

  if (res == SZ_OK)
  {
    UInt64 unpackPos = p->UnpackPositions[fileIndex];
    *offset = (size_t)(unpackPos - p->UnpackPositions[p->FolderToFile[folderIndex]]);
    *outSizeProcessed = (size_t)(p->UnpackPositions[fileIndex + 1] - unpackPos);
    if (*offset + *outSizeProcessed > *outBufferSize)
      return SZ_ERROR_FAIL;
    if (SzBitWithVals_Check(&p->CRCs, fileIndex))
      if (CrcCalc(*tempBuf + *offset, *outSizeProcessed) != p->CRCs.Vals[fileIndex])
        res = SZ_ERROR_CRC;
  }

  return res;
}